

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen_cs_example.cc
# Opt level: O0

void GEN_CS::gen_cs_example_sm
               (multi_ex *param_1,uint32_t chosen_action,float sign_offset,action_scores action_vals
               ,label *cs_labels)

{
  v_array<COST_SENSITIVE::wclass> *this;
  v_array<COST_SENSITIVE::wclass> *pvVar1;
  action_score *paVar2;
  uint32_t in_ESI;
  wclass wc;
  uint32_t current_action;
  uint32_t i;
  wclass *in_stack_ffffffffffffffb8;
  v_array<COST_SENSITIVE::wclass> *in_stack_ffffffffffffffc0;
  uint local_1c;
  
  v_array<COST_SENSITIVE::wclass>::clear(in_stack_ffffffffffffffc0);
  local_1c = 0;
  while( true ) {
    this = (v_array<COST_SENSITIVE::wclass> *)(ulong)local_1c;
    pvVar1 = (v_array<COST_SENSITIVE::wclass> *)
             v_array<ACTION_SCORE::action_score>::size
                       ((v_array<ACTION_SCORE::action_score> *)&stack0x00000008);
    if (pvVar1 <= this) break;
    paVar2 = v_array<ACTION_SCORE::action_score>::operator[]
                       ((v_array<ACTION_SCORE::action_score> *)&stack0x00000008,(ulong)local_1c);
    if (paVar2->action == in_ESI) {
      v_array<ACTION_SCORE::action_score>::operator[]
                ((v_array<ACTION_SCORE::action_score> *)&stack0x00000008,(ulong)local_1c);
    }
    else {
      v_array<ACTION_SCORE::action_score>::operator[]
                ((v_array<ACTION_SCORE::action_score> *)&stack0x00000008,(ulong)local_1c);
    }
    v_array<COST_SENSITIVE::wclass>::push_back(this,in_stack_ffffffffffffffb8);
    local_1c = local_1c + 1;
  }
  return;
}

Assistant:

void gen_cs_example_sm(multi_ex&, uint32_t chosen_action, float sign_offset,
    ACTION_SCORE::action_scores action_vals,
    COST_SENSITIVE::label& cs_labels)
{
  cs_labels.costs.clear();
  for (uint32_t i = 0; i < action_vals.size(); i++)
  {
    uint32_t current_action = action_vals[i].action;
    COST_SENSITIVE::wclass wc = {0., current_action, 0., 0.};

    if (current_action == chosen_action)
      wc.x = action_vals[i].score + sign_offset;
    else
      wc.x = action_vals[i].score - sign_offset;

    // TODO: This clipping is conceptually unnecessary because the example weight for this instance should be close to 0.
    if (wc.x > 100.)
      wc.x = 100.0;
    if (wc.x < -100.)
      wc.x = -100.0;

    cs_labels.costs.push_back(wc);
  }
}